

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

void __thiscall cfd::core::HashUtil::HashUtil(HashUtil *this,HashUtil *object)

{
  HashUtil *object_local;
  HashUtil *this_local;
  
  this->_vptr_HashUtil = (_func_int **)&PTR__HashUtil_008802e0;
  ByteData::ByteData(&this->buffer_);
  this->hash_type_ = object->hash_type_;
  ByteData::operator=(&this->buffer_,&object->buffer_);
  return;
}

Assistant:

HashUtil::HashUtil(const HashUtil &object) {
  hash_type_ = object.hash_type_;
  buffer_ = object.buffer_;
}